

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_Font * ON_Font::GetManagedFont
                    (double point_size,wchar_t *name,Weight font_weight,Style font_style)

{
  bool bRtfBold;
  byte bVar1;
  uint logfont_charset;
  undefined1 local_f0 [8];
  ON_Font f;
  ON_Font *installed_font;
  Style font_style_local;
  Weight font_weight_local;
  wchar_t *name_local;
  double point_size_local;
  
  bRtfBold = IsBoldWeight(font_weight);
  f.m_managed_installed_font_and_bits =
       (ON__UINT_PTR)InstalledFontFromRichTextProperties(name,bRtfBold,font_style == Italic);
  if ((ON_Font *)f.m_managed_installed_font_and_bits == (ON_Font *)0x0) {
    bVar1 = WindowsLogfontCharSetFromFaceName(name);
    point_size_local =
         (double)GetManagedFont(point_size,name,font_weight,font_style,Default.m_font_stretch,
                                (bool)(Default.m_font_bUnderlined & 1),
                                (bool)(Default.m_font_bStrikethrough & 1),1.6,(uint)bVar1);
  }
  else if ((point_size <= 0.0) || (256.0 <= point_size)) {
    point_size_local = (double)ManagedFont((ON_Font *)f.m_managed_installed_font_and_bits);
  }
  else {
    ON_Font((ON_Font *)local_f0,(ON_Font *)f.m_managed_installed_font_and_bits);
    f._0_8_ = point_size;
    point_size_local = (double)ManagedFont((ON_Font *)local_f0);
    ~ON_Font((ON_Font *)local_f0);
  }
  return (ON_Font *)point_size_local;
}

Assistant:

const ON_Font* ON_Font::GetManagedFont(
  double point_size,
  const wchar_t* name,
  ON_Font::Weight font_weight,
  ON_Font::Style font_style
  )
{
  // Using ON_Font::InstalledFontFromRichTextProperties() fixes lots 
  // of RTF parsing bugs including RH-49028 and "Arial Black" bugs.
  // Depending on the context, name can be LOGFONT, PostScript, Family+Face, Family, ...
  // The font_weight parameter is typically a "face" indication. 
  // Treating it as a literal value causes more bugs than it fixes.
  const ON_Font* installed_font = ON_Font::InstalledFontFromRichTextProperties(
    name, 
    ON_Font::IsBoldWeight(font_weight), 
    (ON_Font::Style::Italic == font_style)
  );
  if (nullptr != installed_font)
  {
    if (point_size > 0.0 && point_size < ON_Font::AnnotationFontApplePointSize)
    {
      ON_Font f(*installed_font);
      f.m_point_size = point_size;
      return f.ManagedFont();
    }
    return installed_font->ManagedFont();
  }

  // Less reliable approach
  const unsigned int logfont_charset = static_cast<unsigned int>(ON_Font::WindowsLogfontCharSetFromFaceName(name));

  return ON_Font::GetManagedFont(
    point_size,
    name, 
    font_weight,
    font_style,
    ON_Font::Default.m_font_stretch,
    ON_Font::Default.m_font_bUnderlined,
    ON_Font::Default.m_font_bStrikethrough,
    ON_FontMetrics::DefaultLineFeedRatio,
    logfont_charset
    );
}